

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randname.c
# Opt level: O0

void build_prob(unsigned_short (*probs) [27] [28],char **learn)

{
  int iVar1;
  int local_34;
  byte *pbStack_30;
  int i;
  char *ch;
  int local_20;
  int c_next;
  int c_cur;
  int c_prev;
  char **learn_local;
  unsigned_short (*probs_local) [27] [28];
  
  for (local_34 = 0; learn[local_34] != (char *)0x0; local_34 = local_34 + 1) {
    local_20 = 0x1a;
    c_next = 0x1a;
    for (pbStack_30 = (byte *)learn[local_34]; *pbStack_30 != 0; pbStack_30 = pbStack_30 + 1) {
      iVar1 = tolower((uint)*pbStack_30);
      iVar1 = iVar1 + -0x61;
      probs[c_next][local_20][iVar1] = probs[c_next][local_20][iVar1] + 1;
      probs[c_next][local_20][0x1b] = probs[c_next][local_20][0x1b] + 1;
      c_next = local_20;
      local_20 = iVar1;
    }
    probs[c_next][local_20][0x1a] = probs[c_next][local_20][0x1a] + 1;
    probs[c_next][local_20][0x1b] = probs[c_next][local_20][0x1b] + 1;
  }
  return;
}

Assistant:

static void build_prob(name_probs probs, const char **learn)
{
	int c_prev, c_cur, c_next;
	const char *ch;
	int i;

	/* Build raw frequencies */
	for (i = 0; learn[i] != NULL; i++) {
		c_prev = c_cur = S_WORD;
		ch = learn[i];

		/* Iterate over the next word */
		while (*ch != '\0') {
			c_next = A2I(tolower((unsigned char)*ch));

			probs[c_prev][c_cur][c_next]++;
			probs[c_prev][c_cur][TOTAL]++;
                        
			/* Step on */
			c_prev = c_cur;
			c_cur = c_next;
			ch++;
		}

		probs[c_prev][c_cur][E_WORD]++;
		probs[c_prev][c_cur][TOTAL]++;
	}
}